

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

json_iterator __thiscall JSONNode::begin(JSONNode *this)

{
  internalJSONNode *piVar1;
  JSONNode *in_RSI;
  
  makeUniqueInternal(in_RSI);
  piVar1 = (internalJSONNode *)internalJSONNode::begin(in_RSI->internal);
  this->internal = piVar1;
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::begin(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("begin"));
	   makeUniqueInternal();
	   return json_iterator(internal -> begin());
    }